

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_he_2014.h
# Opt level: O2

void __thiscall CTB<RemSP>::SecondScan(CTB<RemSP> *this)

{
  int iVar1;
  Mat1i *pMVar2;
  uint *puVar3;
  uint uVar4;
  int r_i;
  long lVar5;
  long lVar6;
  long lVar7;
  
  uVar4 = RemSP::Flatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar4;
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  for (lVar5 = 0; puVar3 = RemSP::P_, lVar5 < *(int *)&pMVar2->field_0x8; lVar5 = lVar5 + 1) {
    lVar6 = **(long **)&pMVar2->field_0x48 * lVar5 + *(long *)&pMVar2->field_0x10;
    iVar1 = *(int *)&pMVar2->field_0xc;
    for (lVar7 = 0; (long)iVar1 * 4 != lVar7; lVar7 = lVar7 + 4) {
      *(uint *)(lVar6 + lVar7) = puVar3[*(uint *)(lVar6 + lVar7)];
    }
  }
  return;
}

Assistant:

void SecondScan() 
    {
        n_labels_ = LabelsSolver::Flatten();

        // Second scan
        for (int r_i = 0; r_i < img_labels_.rows; ++r_i) {
            unsigned int *img_labels_row_start = img_labels_.ptr<unsigned int>(r_i);
            unsigned int *img_labels_row_end = img_labels_row_start + img_labels_.cols;
            unsigned int *img_labels_row = img_labels_row_start;
            for (int c_i = 0; img_labels_row != img_labels_row_end; ++img_labels_row, ++c_i) {
                *img_labels_row = LabelsSolver::GetLabel(*img_labels_row);
            }
        }
    }